

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_rtti.cpp
# Opt level: O2

void __thiscall L15_5::Magnificent::say(Magnificent *this)

{
  std::operator<<((ostream *)&std::cout,"I hold the character ");
}

Assistant:

void say() const {
            cout << "I hold the character " << _ch << " and the integer " << this->get_value() << "!\n";
        }